

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyBoard.cpp
# Opt level: O3

int kbhit(void)

{
  ssize_t sVar1;
  int iVar2;
  uchar ch;
  byte local_19;
  
  iVar2 = 1;
  if (peek_character == -1) {
    new_settings.c_cc[6] = '\0';
    iVar2 = 0;
    tcsetattr(0,0,(termios *)&new_settings);
    sVar1 = read(0,&local_19,1);
    new_settings.c_cc[6] = '\x01';
    tcsetattr(0,0,(termios *)&new_settings);
    if ((int)sVar1 == 1) {
      peek_character = (int)local_19;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int kbhit()
{
    unsigned char ch;
    int nread;

    if (peek_character != -1) return 1;
    new_settings.c_cc[VMIN]=0;
    tcsetattr(0, TCSANOW, &new_settings);
    nread = read(0,&ch,1);
    new_settings.c_cc[VMIN]=1;
    tcsetattr(0, TCSANOW, &new_settings);
    if(nread == 1)
    {
        peek_character = ch;
        return 1;
    }
    return 0;
}